

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O3

QCalendarWidget * __thiscall QCalendarPopup::verifyCalendarInstance(QCalendarPopup *this)

{
  Data *pDVar1;
  QObject *this_00;
  
  pDVar1 = (this->calendar).wp.d;
  if ((pDVar1 == (Data *)0x0) ||
     (this_00 = (this->calendar).wp.value, this_00 == (QObject *)0x0 || *(int *)(pDVar1 + 4) == 0))
  {
    this_00 = (QObject *)operator_new(0x28);
    QCalendarWidget::QCalendarWidget((QCalendarWidget *)this_00,&this->super_QWidget);
    QCalendarWidget::setCalendar((QCalendarWidget *)this_00);
    QCalendarWidget::setVerticalHeaderFormat((QCalendarWidget *)this_00,NoVerticalHeader);
    setCalendarWidget(this,(QCalendarWidget *)this_00);
  }
  else if (*(int *)(pDVar1 + 4) == 0) {
    this_00 = (QObject *)0x0;
  }
  return (QCalendarWidget *)this_00;
}

Assistant:

QCalendarWidget *QCalendarPopup::verifyCalendarInstance()
{
    if (calendar.isNull()) {
        QCalendarWidget *cw = new QCalendarWidget(this);
        cw->setCalendar(calendarSystem);
        cw->setVerticalHeaderFormat(QCalendarWidget::NoVerticalHeader);
#ifdef QT_KEYPAD_NAVIGATION
        if (QApplicationPrivate::keypadNavigationEnabled())
            cw->setHorizontalHeaderFormat(QCalendarWidget::SingleLetterDayNames);
#endif
        setCalendarWidget(cw);
        return cw;
    } else {
        return calendar.data();
    }
}